

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O1

uint __thiscall
Memory::HeapBlockMap32::GetMarkCount(HeapBlockMap32 *this,void *address,uint pageCount)

{
  undefined4 *puVar1;
  L2MapChunk *this_00;
  code *pcVar2;
  bool bVar3;
  BVIndex BVar4;
  BVStatic<256UL> *this_01;
  uint uVar5;
  BVIndex startOffset;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  undefined8 *in_FS_OFFSET;
  
  uVar10 = (ulong)pageCount;
  uVar7 = (ulong)address >> 0x14 & 0xfff;
  uVar5 = (uint)address >> 0xc & 0xff;
  uVar9 = 0;
  puVar1 = (undefined4 *)*in_FS_OFFSET;
  do {
    uVar6 = (uint)uVar7;
    this_00 = this->map[uVar7];
    if (this_00 == (L2MapChunk *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                         ,0xd9,"(l2map != nullptr)","l2map != nullptr");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar1 = 0;
      bVar3 = true;
    }
    else {
      uVar8 = 0x100;
      if (0x100 < uVar5) {
        uVar8 = uVar5;
      }
      startOffset = uVar5 << 8;
      do {
        if (uVar8 == uVar5) {
          uVar6 = uVar6 + 1;
          bVar3 = true;
          uVar5 = 0;
          goto LAB_00214317;
        }
        this_01 = BVStatic<65536ul>::GetRange<256ul>((BVStatic<65536ul> *)this_00,startOffset);
        BVar4 = BVStatic<256UL>::Count(this_01);
        uVar9 = uVar9 + BVar4;
        uVar5 = uVar5 + 1;
        startOffset = startOffset + 0x100;
        uVar10 = uVar10 - 1;
      } while (uVar10 != 0);
      uVar10 = 0;
      bVar3 = false;
LAB_00214317:
      uVar7 = (ulong)uVar6;
    }
    if (!bVar3) {
      return uVar9;
    }
  } while( true );
}

Assistant:

uint
HeapBlockMap32::GetMarkCount(void * address, uint pageCount)
{
    uint markCount = 0;

    ForEachChunkInAddressRange(address, pageCount, [&](L2MapChunk* l2Map, uint chunkId)
    {
        markCount += l2Map->GetPageMarkBitVector(chunkId /* pageIndex */)->Count();
    });

    return markCount;
}